

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# doh.c
# Opt level: O1

CURLcode Curl_doh_is_resolved(Curl_easy *data,Curl_dns_entry **dnsp)

{
  dynbuf *s;
  int iVar1;
  dohdata *pdVar2;
  sockaddr *psVar3;
  undefined8 uVar4;
  ushort rdlength;
  DOHcode DVar5;
  uint uVar6;
  uchar *puVar7;
  size_t sVar8;
  size_t sVar9;
  Curl_addrinfo *pCVar10;
  Curl_dns_entry *pCVar11;
  uint uVar12;
  char *pcVar13;
  uint uVar14;
  uint uVar15;
  char *pcVar16;
  long lVar17;
  anon_union_16_2_f9ece763_for_ip *paVar18;
  CURLcode CVar19;
  int iVar20;
  ulong uVar21;
  ushort uVar22;
  ushort uVar23;
  long lVar24;
  dohentry *pdVar25;
  bool bVar26;
  DOHcode rc [2];
  dohentry de;
  Curl_addrinfo *local_388;
  Curl_addrinfo *local_358;
  undefined8 local_340;
  undefined8 local_338;
  Curl_dns_entry **local_330;
  uint local_328 [2];
  char local_31e [126];
  dohentry local_2a0;
  
  pdVar2 = (data->req).doh;
  *dnsp = (Curl_dns_entry *)0x0;
  if (pdVar2 == (dohdata *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
  if ((pdVar2->probe[0].easy == (CURL *)0x0) && (pdVar2->probe[1].easy == (CURL *)0x0)) {
    Curl_failf(data,"Could not DOH-resolve: %s",(data->state).async.hostname);
    return (((data->conn->bits).field_0x5 & 4) == 0) + CURLE_COULDNT_RESOLVE_PROXY;
  }
  if (pdVar2->pending != 0) {
    return CURLE_OK;
  }
  local_340 = 0;
  lVar17 = 8;
  local_330 = dnsp;
  do {
    curl_multi_remove_handle
              (data->multi,*(Curl_easy **)(pdVar2->probe[0].dohbuffer + lVar17 + -0x14));
    Curl_close((Curl_easy **)(pdVar2->probe[0].dohbuffer + lVar17 + -0x14));
    lVar17 = lVar17 + 0x238;
  } while (lVar17 == 0x240);
  lVar17 = 0;
  memset(&local_2a0,0,0x270);
  local_2a0.ttl = 0x7fffffff;
  do {
    Curl_dyn_init((dynbuf *)((long)&local_2a0.cname[0].bufr + lVar17),0x100);
    lVar17 = lVar17 + 0x20;
  } while (lVar17 != 0x80);
  lVar17 = 0;
LAB_0011609d:
  if (pdVar2->probe[lVar17].dnstype != 0) {
    s = &pdVar2->probe[lVar17].serverdoh;
    puVar7 = Curl_dyn_uptr(s);
    sVar8 = Curl_dyn_len(s);
    uVar12 = pdVar2->probe[lVar17].dnstype;
    local_328[0] = 0xc;
    uVar21 = 4;
    if ((((0xb < sVar8) && (uVar21 = 0xc, puVar7 != (uchar *)0x0)) && (*puVar7 == '\0')) &&
       ((puVar7[1] == '\0' && (uVar21 = 8, (puVar7[3] & 0xf) == 0)))) {
      for (uVar22 = *(ushort *)(puVar7 + 4) << 8 | *(ushort *)(puVar7 + 4) >> 8; uVar22 != 0;
          uVar22 = uVar22 - 1) {
        DVar5 = skipqname(puVar7,sVar8,local_328);
        if (DVar5 != DOH_OK) goto LAB_00116460;
        if (sVar8 < local_328[0] + 4) {
          uVar21 = 2;
          goto LAB_00116115;
        }
        local_328[0] = local_328[0] + 4;
      }
      uVar23 = *(ushort *)(puVar7 + 6) << 8 | *(ushort *)(puVar7 + 6) >> 8;
      uVar22 = 0;
      do {
        if (uVar23 == 0) {
          uVar23 = *(ushort *)(puVar7 + 8) << 8 | *(ushort *)(puVar7 + 8) >> 8;
          goto joined_r0x0011633e;
        }
        DVar5 = skipqname(puVar7,sVar8,local_328);
        if (DVar5 == DOH_OK) {
          uVar6 = local_328[0] + 2;
          uVar21 = 2;
          uVar15 = local_328[0];
          if (sVar8 < uVar6) goto LAB_00116318;
          uVar22 = *(ushort *)(puVar7 + (int)local_328[0]) << 8 |
                   *(ushort *)(puVar7 + (int)local_328[0]) >> 8;
          if (((uVar22 != 5) && (uVar22 != 0x27)) && (uVar12 != uVar22)) {
            uVar21 = 9;
            goto LAB_00116318;
          }
          uVar14 = local_328[0] + 4;
          uVar15 = uVar6;
          if (sVar8 < uVar14) goto LAB_00116318;
          if ((ushort)(*(ushort *)(puVar7 + (int)uVar6) << 8 | *(ushort *)(puVar7 + (int)uVar6) >> 8
                      ) != 1) {
            uVar21 = 10;
            goto LAB_00116318;
          }
          uVar6 = local_328[0] + 8;
          uVar15 = uVar14;
          if (sVar8 < uVar6) goto LAB_00116318;
          uVar15 = *(uint *)(puVar7 + (int)uVar14);
          uVar15 = uVar15 >> 0x18 | (uVar15 & 0xff0000) >> 8 | (uVar15 & 0xff00) << 8 |
                   uVar15 << 0x18;
          if (uVar15 < local_2a0.ttl) {
            local_2a0.ttl = uVar15;
          }
          local_328[0] = local_328[0] + 10;
          uVar15 = uVar6;
          if (sVar8 < local_328[0]) goto LAB_00116318;
          rdlength = *(ushort *)(puVar7 + (int)uVar6) << 8 | *(ushort *)(puVar7 + (int)uVar6) >> 8;
          uVar6 = local_328[0] + rdlength;
          uVar15 = local_328[0];
          if (sVar8 < uVar6) goto LAB_00116318;
          DVar5 = rdata(puVar7,sVar8,rdlength,uVar22,local_328[0],&local_2a0);
          if (DVar5 != DOH_OK) goto LAB_00116217;
          uVar23 = uVar23 - 1;
          bVar26 = true;
          uVar21 = (ulong)local_358 & 0xffffffff;
          local_328[0] = uVar6;
        }
        else {
LAB_00116217:
          uVar21 = (ulong)DVar5;
          uVar15 = local_328[0];
LAB_00116318:
          local_328[0] = uVar15;
          bVar26 = false;
        }
        local_358 = (Curl_addrinfo *)uVar21;
      } while (bVar26);
    }
    goto LAB_00116115;
  }
  goto LAB_00116183;
joined_r0x0011633e:
  if (uVar23 == 0) goto LAB_001163a6;
  DVar5 = skipqname(puVar7,sVar8,local_328);
  if (DVar5 != DOH_OK) goto LAB_00116460;
  uVar12 = local_328[0] + 8;
  uVar21 = 2;
  if (((sVar8 < uVar12) || (uVar15 = local_328[0] + 10, local_328[0] = uVar12, sVar8 < uVar15)) ||
     (uVar12 = (ushort)(*(ushort *)(puVar7 + (int)uVar12) << 8 |
                       *(ushort *)(puVar7 + (int)uVar12) >> 8) + uVar15, local_328[0] = uVar15,
     sVar8 < uVar12)) goto LAB_00116115;
  uVar23 = uVar23 - 1;
  local_328[0] = uVar12;
  goto joined_r0x0011633e;
LAB_001163a6:
  for (uVar23 = *(ushort *)(puVar7 + 10) << 8 | *(ushort *)(puVar7 + 10) >> 8; uVar23 != 0;
      uVar23 = uVar23 - 1) {
    DVar5 = skipqname(puVar7,sVar8,local_328);
    if (DVar5 != DOH_OK) goto LAB_00116460;
    uVar12 = local_328[0] + 8;
    uVar21 = 2;
    if (((sVar8 < uVar12) || (uVar15 = local_328[0] + 10, local_328[0] = uVar12, sVar8 < uVar15)) ||
       (uVar12 = (ushort)(*(ushort *)(puVar7 + (int)uVar12) << 8 |
                         *(ushort *)(puVar7 + (int)uVar12) >> 8) + uVar15, local_328[0] = uVar15,
       sVar8 < uVar12)) goto LAB_00116115;
    local_328[0] = uVar12;
  }
  uVar21 = 7;
  if (sVar8 == local_328[0]) {
    uVar12 = 0;
    if (local_2a0.numaddr == 0 && local_2a0.numcname == 0) {
      uVar12 = 0xb;
    }
    if (uVar22 == 2) {
      uVar12 = 0;
    }
    uVar21 = (ulong)uVar12;
  }
LAB_00116115:
  uVar12 = (uint)uVar21;
  *(uint *)((long)&local_340 + lVar17 * 4) = uVar12;
  Curl_dyn_free(s);
  if (uVar12 != 0) {
    pcVar16 = "bad error code";
    if (uVar12 < 0xe) {
      pcVar16 = errors_rel + *(int *)(errors_rel + uVar21 * 4);
    }
    pcVar13 = "AAAA";
    if (pdVar2->probe[lVar17].dnstype == 1) {
      pcVar13 = "A";
    }
    Curl_infof(data,"DOH: %s type %s for %s",pcVar16,pcVar13,pdVar2->host);
  }
LAB_00116183:
  bVar26 = lVar17 != 0;
  lVar17 = lVar17 + 1;
  if (bVar26) goto LAB_00116473;
  goto LAB_0011609d;
LAB_00116460:
  uVar21 = (ulong)DVar5;
  goto LAB_00116115;
LAB_00116473:
  if ((int)local_340 != 0) {
    CVar19 = CURLE_COULDNT_RESOLVE_HOST;
    if (local_340._4_4_ != 0) goto LAB_001168c7;
  }
  Curl_infof(data,"DOH Host name: %s",pdVar2->host);
  Curl_infof(data,"TTL: %u seconds",(ulong)local_2a0.ttl);
  if (0 < local_2a0.numaddr) {
    puVar7 = local_2a0.addr[0].ip.v4 + 1;
    lVar17 = 0;
    do {
      iVar1 = local_2a0.addr[lVar17].type;
      if (iVar1 == 0x1c) {
        curl_msnprintf((char *)local_328,0x80,"DOH AAAA: ");
        sVar8 = 0x76;
        uVar21 = 0xfffffffffffffffe;
        pcVar16 = local_31e;
        do {
          pcVar13 = ":";
          if (uVar21 == 0xfffffffffffffffe) {
            pcVar13 = "";
          }
          curl_msnprintf(pcVar16,sVar8,"%s%02x%02x",pcVar13,(ulong)puVar7[uVar21 + 1],
                         (ulong)puVar7[uVar21 + 2]);
          sVar9 = strlen(pcVar16);
          sVar8 = sVar8 - sVar9;
          pcVar16 = pcVar16 + sVar9;
          uVar21 = uVar21 + 2;
        } while (uVar21 < 0xe);
        Curl_infof(data,"%s",local_328);
      }
      else if (iVar1 == 1) {
        Curl_infof(data,"DOH A: %u.%u.%u.%u",(ulong)local_2a0.addr[lVar17].ip.v4[0],
                   (ulong)local_2a0.addr[lVar17].ip.v4[1],(ulong)local_2a0.addr[lVar17].ip.v4[2],
                   (ulong)local_2a0.addr[lVar17].ip.v4[3]);
      }
      lVar17 = lVar17 + 1;
      puVar7 = puVar7 + 0x14;
    } while (lVar17 < local_2a0.numaddr);
  }
  if (0 < local_2a0.numcname) {
    pdVar25 = &local_2a0;
    lVar17 = 0;
    do {
      pcVar16 = Curl_dyn_ptr(pdVar25->cname);
      Curl_infof(data,"CNAME: %s",pcVar16);
      lVar17 = lVar17 + 1;
      pdVar25 = (dohentry *)(pdVar25->cname + 1);
    } while (lVar17 < local_2a0.numcname);
  }
  pcVar16 = pdVar2->host;
  sVar9 = strlen(pcVar16);
  if (local_2a0.numaddr < 1) {
    bVar26 = true;
    local_388 = (Curl_addrinfo *)0x0;
  }
  else {
    local_338 = 0;
    uVar22 = (ushort)pdVar2->port;
    paVar18 = &local_2a0.addr[0].ip;
    lVar17 = 0;
    local_358 = (Curl_addrinfo *)0x0;
    local_388 = (Curl_addrinfo *)0x0;
    do {
      iVar1 = ((dohaddr *)((long)paVar18 + -4))->type;
      lVar24 = 0x1c;
      if (iVar1 != 0x1c) {
        lVar24 = 0x10;
      }
      pCVar10 = (Curl_addrinfo *)(*Curl_ccalloc)(1,sVar9 + 0x31 + lVar24);
      if (pCVar10 == (Curl_addrinfo *)0x0) {
        local_338 = 0x1b;
      }
      else {
        pCVar10->ai_addr = (sockaddr *)(pCVar10 + 1);
        pcVar13 = (char *)((long)&pCVar10[1].ai_flags + lVar24);
        pCVar10->ai_canonname = pcVar13;
        memcpy(pcVar13,pcVar16,sVar9 + 1);
        if (local_388 == (Curl_addrinfo *)0x0) {
          local_388 = pCVar10;
        }
        if (local_358 != (Curl_addrinfo *)0x0) {
          local_358->ai_next = pCVar10;
        }
        iVar20 = (uint)(iVar1 == 0x1c) * 8 + 2;
        pCVar10->ai_family = iVar20;
        pCVar10->ai_socktype = 1;
        pCVar10->ai_addrlen = (curl_socklen_t)lVar24;
        psVar3 = pCVar10->ai_addr;
        if (iVar1 == 0x1c) {
          uVar4 = *(undefined8 *)((long)paVar18 + 8);
          *(undefined8 *)(psVar3->sa_data + 6) = *(undefined8 *)paVar18;
          psVar3[1].sa_family = (short)uVar4;
          psVar3[1].sa_data[0] = (char)((ulong)uVar4 >> 0x10);
          psVar3[1].sa_data[1] = (char)((ulong)uVar4 >> 0x18);
          psVar3[1].sa_data[2] = (char)((ulong)uVar4 >> 0x20);
          psVar3[1].sa_data[3] = (char)((ulong)uVar4 >> 0x28);
          psVar3[1].sa_data[4] = (char)((ulong)uVar4 >> 0x30);
          psVar3[1].sa_data[5] = (char)((ulong)uVar4 >> 0x38);
        }
        else {
          *(undefined4 *)(psVar3->sa_data + 2) = *(undefined4 *)paVar18;
        }
        psVar3->sa_family = (sa_family_t)iVar20;
        *(ushort *)psVar3->sa_data = uVar22 << 8 | uVar22 >> 8;
        local_358 = pCVar10;
      }
      if (pCVar10 == (Curl_addrinfo *)0x0) break;
      lVar17 = lVar17 + 1;
      paVar18 = (anon_union_16_2_f9ece763_for_ip *)((long)paVar18 + 0x14);
    } while (lVar17 < local_2a0.numaddr);
    bVar26 = (int)local_338 == 0;
  }
  pdVar25 = &local_2a0;
  if (!bVar26) {
    Curl_freeaddrinfo(local_388);
    local_388 = (Curl_addrinfo *)0x0;
  }
  if (local_388 == (Curl_addrinfo *)0x0) {
    CVar19 = CURLE_COULDNT_RESOLVE_HOST;
    if (0 < local_2a0.numcname) {
      lVar17 = 0;
      do {
        Curl_dyn_free(pdVar25->cname);
        lVar17 = lVar17 + 1;
        pdVar25 = (dohentry *)(pdVar25->cname + 1);
      } while (lVar17 < local_2a0.numcname);
    }
  }
  else {
    if (data->share != (Curl_share *)0x0) {
      Curl_share_lock(data,CURL_LOCK_DATA_DNS,CURL_LOCK_ACCESS_SINGLE);
    }
    pCVar11 = Curl_cache_addr(data,local_388,pdVar2->host,pdVar2->port);
    if (data->share != (Curl_share *)0x0) {
      Curl_share_unlock(data,CURL_LOCK_DATA_DNS);
    }
    if (pCVar11 == (Curl_dns_entry *)0x0) {
      Curl_freeaddrinfo(local_388);
      CVar19 = CURLE_COULDNT_RESOLVE_HOST;
    }
    else {
      (data->state).async.dns = pCVar11;
      *local_330 = pCVar11;
      CVar19 = CURLE_OK;
    }
  }
  if (local_388 == (Curl_addrinfo *)0x0) {
    return CURLE_OUT_OF_MEMORY;
  }
LAB_001168c7:
  if (0 < local_2a0.numcname) {
    pdVar25 = &local_2a0;
    lVar17 = 0;
    do {
      Curl_dyn_free(pdVar25->cname);
      lVar17 = lVar17 + 1;
      pdVar25 = (dohentry *)(pdVar25->cname + 1);
    } while (lVar17 < local_2a0.numcname);
  }
  (*Curl_cfree)((data->req).doh);
  (data->req).doh = (dohdata *)0x0;
  return CVar19;
}

Assistant:

CURLcode Curl_doh_is_resolved(struct Curl_easy *data,
                              struct Curl_dns_entry **dnsp)
{
  CURLcode result;
  struct dohdata *dohp = data->req.doh;
  *dnsp = NULL; /* defaults to no response */
  if(!dohp)
    return CURLE_OUT_OF_MEMORY;

  if(!dohp->probe[DOH_PROBE_SLOT_IPADDR_V4].easy &&
     !dohp->probe[DOH_PROBE_SLOT_IPADDR_V6].easy) {
    failf(data, "Could not DOH-resolve: %s", data->state.async.hostname);
    return data->conn->bits.proxy?CURLE_COULDNT_RESOLVE_PROXY:
      CURLE_COULDNT_RESOLVE_HOST;
  }
  else if(!dohp->pending) {
    DOHcode rc[DOH_PROBE_SLOTS] = {
      DOH_OK, DOH_OK
    };
    struct dohentry de;
    int slot;
    /* remove DOH handles from multi handle and close them */
    for(slot = 0; slot < DOH_PROBE_SLOTS; slot++) {
      curl_multi_remove_handle(data->multi, dohp->probe[slot].easy);
      Curl_close(&dohp->probe[slot].easy);
    }
    /* parse the responses, create the struct and return it! */
    de_init(&de);
    for(slot = 0; slot < DOH_PROBE_SLOTS; slot++) {
      struct dnsprobe *p = &dohp->probe[slot];
      if(!p->dnstype)
        continue;
      rc[slot] = doh_decode(Curl_dyn_uptr(&p->serverdoh),
                            Curl_dyn_len(&p->serverdoh),
                            p->dnstype,
                            &de);
      Curl_dyn_free(&p->serverdoh);
      if(rc[slot]) {
        infof(data, "DOH: %s type %s for %s", doh_strerror(rc[slot]),
              type2name(p->dnstype), dohp->host);
      }
    } /* next slot */

    result = CURLE_COULDNT_RESOLVE_HOST; /* until we know better */
    if(!rc[DOH_PROBE_SLOT_IPADDR_V4] || !rc[DOH_PROBE_SLOT_IPADDR_V6]) {
      /* we have an address, of one kind or other */
      struct Curl_dns_entry *dns;
      struct Curl_addrinfo *ai;

      infof(data, "DOH Host name: %s", dohp->host);
      showdoh(data, &de);

      ai = doh2ai(&de, dohp->host, dohp->port);
      if(!ai) {
        de_cleanup(&de);
        return CURLE_OUT_OF_MEMORY;
      }

      if(data->share)
        Curl_share_lock(data, CURL_LOCK_DATA_DNS, CURL_LOCK_ACCESS_SINGLE);

      /* we got a response, store it in the cache */
      dns = Curl_cache_addr(data, ai, dohp->host, dohp->port);

      if(data->share)
        Curl_share_unlock(data, CURL_LOCK_DATA_DNS);

      if(!dns) {
        /* returned failure, bail out nicely */
        Curl_freeaddrinfo(ai);
      }
      else {
        data->state.async.dns = dns;
        *dnsp = dns;
        result = CURLE_OK;      /* address resolution OK */
      }
    } /* address processing done */

    /* Now process any build-specific attributes retrieved from DNS */

    /* All done */
    de_cleanup(&de);
    Curl_safefree(data->req.doh);
    return result;

  } /* !dohp->pending */

  /* else wait for pending DOH transactions to complete */
  return CURLE_OK;
}